

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O2

void __thiscall LiteScript::Namer::Namer(Namer *this,Namer *n)

{
  Variable::Variable(&this->global,&n->global);
  Nullable<LiteScript::Variable>::Nullable(&this->current,&n->current);
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
            (&this->heap,&n->heap);
  return;
}

Assistant:

LiteScript::Namer::Namer(const Namer &n) :
    global(n.global), current(n.current), heap(n.heap) {}